

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O1

void __thiscall
pbrt::BinaryWriter::
write<std::shared_ptr<pbrt::Camera>,std::allocator<std::shared_ptr<pbrt::Camera>>,void,void>
          (BinaryWriter *this,
          vector<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_> *t)

{
  pointer psVar1;
  pointer psVar2;
  long lVar3;
  long lVar4;
  shared_ptr<pbrt::Camera> local_48;
  long local_38;
  
  psVar1 = (t->
           super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  psVar2 = (t->
           super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)psVar1 - (long)psVar2 >> 4;
  lVar4 = 8;
  local_38 = lVar3;
  writeRaw(this,&local_38,8);
  if (psVar1 != psVar2) {
    lVar3 = lVar3 + (ulong)(lVar3 == 0);
    do {
      psVar1 = (t->
               super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_48.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)((long)psVar1 + lVar4 + -8);
      local_48.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            ((long)&(psVar1->super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
            lVar4);
      if (local_48.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_48.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_48.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_48.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_48.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
        }
      }
      write<pbrt::Camera>(this,&local_48);
      if (local_48.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      lVar4 = lVar4 + 0x10;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  return;
}

Assistant:

void write(const std::vector<T, A> &t)
    {
      size_t size = t.size();
      write((uint64_t)size);
      for (size_t i=0;i<size;i++)
        write(t[i]);
    }